

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Slider.cxx
# Opt level: O2

void __thiscall Fl_Slider::draw(Fl_Slider *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  
  if ((char)(this->super_Fl_Valuator).super_Fl_Widget.damage_ < '\0') {
    Fl_Widget::draw_box((Fl_Widget *)this);
  }
  iVar1 = (this->super_Fl_Valuator).super_Fl_Widget.x_;
  iVar5 = Fl::box_dx((uint)(this->super_Fl_Valuator).super_Fl_Widget.box_);
  iVar2 = (this->super_Fl_Valuator).super_Fl_Widget.y_;
  iVar6 = Fl::box_dy((uint)(this->super_Fl_Valuator).super_Fl_Widget.box_);
  iVar3 = (this->super_Fl_Valuator).super_Fl_Widget.w_;
  iVar7 = Fl::box_dw((uint)(this->super_Fl_Valuator).super_Fl_Widget.box_);
  iVar4 = (this->super_Fl_Valuator).super_Fl_Widget.h_;
  iVar8 = Fl::box_dh((uint)(this->super_Fl_Valuator).super_Fl_Widget.box_);
  draw(this,iVar1 + iVar5,iVar2 + iVar6,iVar3 - iVar7,iVar4 - iVar8);
  return;
}

Assistant:

void Fl_Slider::draw() {
  if (damage()&FL_DAMAGE_ALL) draw_box();
  draw(x()+Fl::box_dx(box()),
       y()+Fl::box_dy(box()),
       w()-Fl::box_dw(box()),
       h()-Fl::box_dh(box()));
}